

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_tests.cpp
# Opt level: O0

void __thiscall
net_tests::anon_unknown_17::V2TransportTester::SendGarbage
          (V2TransportTester *this,Span<const_unsigned_char> garbage)

{
  long lVar1;
  Span<const_unsigned_char> data;
  Span<const_unsigned_char> *this_00;
  pointer in_RSI;
  V2TransportTester *in_RDI;
  long in_FS_OFFSET;
  Span<const_unsigned_char> *in_stack_ffffffffffffffa8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *other;
  uchar *in_stack_ffffffffffffffe0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  other = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&stack0xffffffffffffffe8;
  this_00 = (Span<const_unsigned_char> *)Span<const_unsigned_char>::begin(in_stack_ffffffffffffffa8)
  ;
  Span<const_unsigned_char>::end(in_stack_ffffffffffffffa8);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::assign<unsigned_char_const*,void>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_00,(uchar *)other,
             (uchar *)in_stack_ffffffffffffffa8);
  Span<unsigned_char_const>::Span<std::vector<unsigned_char,std::allocator<unsigned_char>>>
            (this_00,other,in_stack_ffffffffffffffa8);
  data.m_size = (size_t)in_RSI;
  data.m_data = in_stack_ffffffffffffffe0;
  Send(in_RDI,data);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void SendGarbage(Span<const uint8_t> garbage)
    {
        // Remember the specified garbage (so we can use it as AAD).
        m_sent_garbage.assign(garbage.begin(), garbage.end());
        // Schedule it for sending.
        Send(m_sent_garbage);
    }